

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.hpp
# Opt level: O3

bool ruckig::Block::calculate_block<6ul,true>
               (Block *block,array<ruckig::Profile,_6UL> *valid_profiles,
               size_t valid_profile_counter)

{
  double dVar1;
  Profile *pPVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  Profile *pPVar8;
  long lVar9;
  array<ruckig::Profile,_6UL> *__src;
  char cVar10;
  double *pdVar11;
  undefined8 *puVar12;
  double *pdVar13;
  double *pdVar14;
  undefined8 *puVar15;
  array<double,_2UL> *paVar16;
  void *pvVar17;
  void *__src_00;
  void *pvVar18;
  byte bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_298;
  double local_290;
  double local_288;
  double local_260 [10];
  double local_210 [14];
  undefined4 local_1a0;
  undefined1 local_198 [360];
  
  bVar19 = 0;
  if (valid_profile_counter == 4) {
    dVar21 = valid_profiles->_M_elems[0].t_sum._M_elems[6];
    if ((7.105427357601002e-15 <= ABS(dVar21 - valid_profiles->_M_elems[1].t_sum._M_elems[6])) ||
       (valid_profiles->_M_elems[0].direction == valid_profiles->_M_elems[1].direction)) {
      dVar22 = valid_profiles->_M_elems[3].t_sum._M_elems[6];
      if ((5.6843418860808015e-14 <= ABS(valid_profiles->_M_elems[2].t_sum._M_elems[6] - dVar22)) ||
         (valid_profile_counter = 3,
         valid_profiles->_M_elems[2].direction == valid_profiles->_M_elems[3].direction)) {
        if (5.6843418860808015e-14 <= ABS(dVar21 - dVar22)) {
          return false;
        }
        valid_profile_counter = 3;
        if (valid_profiles->_M_elems[0].direction == valid_profiles->_M_elems[3].direction) {
          return false;
        }
      }
    }
    else {
      memcpy(valid_profiles->_M_elems + 1,valid_profiles->_M_elems + 2,0x23c);
      memcpy(valid_profiles->_M_elems + 2,valid_profiles->_M_elems + 3,0x23c);
      valid_profile_counter = 3;
    }
  }
  else {
    if (valid_profile_counter == 2) {
      dVar21 = valid_profiles->_M_elems[0].t_sum._M_elems[6];
      dVar22 = valid_profiles->_M_elems[1].t_sum._M_elems[6];
      if (ABS(dVar21 - dVar22) < 1.7763568394002505e-15) goto LAB_0014307a;
      pvVar18 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems +
                        (ulong)((uint)(dVar22 <= dVar21) * 0x240));
      memcpy(block,pvVar18,0x23c);
      block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                     (block->p_min).accel.duration;
      cVar10 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
               super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
      if ((bool)cVar10 == true) {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
        cVar10 = '\0';
      }
      if ((block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
      }
      uVar3 = (ulong)((uint)(dVar21 < dVar22) * 0x240);
      dVar20 = *(double *)((long)pvVar18 + 0x68) + *(double *)((long)pvVar18 + 0x168) +
               *(double *)((long)pvVar18 + 0x1c0);
      dVar22 = *(double *)((long)valid_profiles->_M_elems[0].t_sum._M_elems + uVar3 + 0x30) +
               *(double *)((long)valid_profiles->_M_elems[0].brake.t._M_elems + (uVar3 - 8)) +
               *(double *)((long)valid_profiles->_M_elems[0].accel.t._M_elems + (uVar3 - 8));
      pvVar17 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems + uVar3);
      dVar21 = dVar20;
      if (dVar22 <= dVar20) {
        pvVar17 = pvVar18;
        dVar21 = dVar22;
        dVar22 = dVar20;
      }
      memcpy(local_198,pvVar17,0x168);
      dVar20 = *(double *)((long)pvVar17 + 0x168);
      pdVar13 = local_260;
      pdVar11 = (double *)((long)pvVar17 + 0x170);
      pdVar14 = pdVar13;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar14 = *pdVar11;
        pdVar11 = pdVar11 + (ulong)bVar19 * -2 + 1;
        pdVar14 = pdVar14 + (ulong)bVar19 * -2 + 1;
      }
      local_298 = *(double *)((long)pvVar17 + 0x1c0);
      puVar12 = (undefined8 *)((long)pvVar17 + 0x1c8);
      puVar15 = local_210;
      for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar15 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      local_1a0 = *(undefined4 *)((long)pvVar17 + 0x238);
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar21;
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar22;
      memcpy((void *)((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                             _M_payload + 0x10),local_198,0x168);
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
      duration = dVar20;
      paVar16 = (array<double,_2UL> *)
                ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                        _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                        _M_value.profile.brake + 8);
      lVar4 = 10;
      goto LAB_00143577;
    }
    if (valid_profile_counter == 1) {
LAB_0014307a:
      memcpy(block,valid_profiles,0x23c);
      block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                     (block->p_min).accel.duration;
      if ((block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
      }
      if ((block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
        return true;
      }
      return true;
    }
    if ((valid_profile_counter & 1) == 0) {
      return false;
    }
  }
  pPVar8 = valid_profiles->_M_elems;
  lVar4 = valid_profile_counter * 0x240 + -0x240;
  __src = valid_profiles;
  do {
    pPVar8 = pPVar8 + 1;
    dVar21 = __src->_M_elems[0].t_sum._M_elems[6];
    pdVar13 = (pPVar8->t_sum)._M_elems + 6;
    pPVar2 = pPVar8;
    if (dVar21 < *pdVar13 || dVar21 == *pdVar13) {
      pPVar2 = __src->_M_elems;
    }
    __src = (array<ruckig::Profile,_6UL> *)pPVar2;
    lVar4 = lVar4 + -0x240;
  } while (lVar4 != 0);
  memcpy(block,__src,0x23c);
  block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                 (block->p_min).accel.duration;
  cVar10 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
           super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  if ((bool)cVar10 == true) {
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
    cVar10 = '\0';
  }
  cVar7 = (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  if ((bool)cVar7 == true) {
    (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
    cVar7 = '\0';
  }
  lVar4 = ((long)__src - (long)valid_profiles >> 6) * -0x71c71c71c71c71c7;
  if (valid_profile_counter == 5) {
    lVar5 = ((lVar4 + 3U) / 5) * -5 + lVar4 + 3;
    lVar9 = lVar4 + ((lVar4 + 4U) / 5) * -5 + 4;
    lVar6 = (lVar4 + ((lVar4 + 1U) / 5) * -5 + 1) * 0x240;
    pvVar18 = (void *)((long)valid_profiles + lVar6);
    lVar4 = (((lVar4 + 2U) / 5) * -5 + lVar4 + 2) * 0x240;
    pvVar17 = (void *)((long)valid_profiles + lVar4);
    if (*(int *)((long)valid_profiles + lVar6 + 0x234) ==
        *(int *)((long)valid_profiles + lVar4 + 0x234)) {
      dVar22 = *(double *)((long)pvVar18 + 0x68) + *(double *)((long)pvVar18 + 0x168) +
               *(double *)((long)pvVar18 + 0x1c0);
      dVar20 = *(double *)((long)pvVar17 + 0x68) + *(double *)((long)pvVar17 + 0x168) +
               *(double *)((long)pvVar17 + 0x1c0);
      dVar21 = dVar20;
      if (dVar22 < dVar20) {
        pvVar18 = pvVar17;
        dVar21 = dVar22;
        dVar22 = dVar20;
      }
      memcpy(local_198,pvVar18,0x168);
      dVar20 = *(double *)((long)pvVar18 + 0x168);
      puVar12 = (undefined8 *)((long)pvVar18 + 0x170);
      puVar15 = local_260;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar15 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      dVar1 = *(double *)((long)pvVar18 + 0x1c0);
      pdVar13 = (double *)((long)pvVar18 + 0x1c8);
      pdVar11 = local_210;
      for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar11 = *pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
        pdVar11 = pdVar11 + (ulong)bVar19 * -2 + 1;
      }
      local_1a0 = *(undefined4 *)((long)pvVar18 + 0x238);
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar21;
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar22;
      memcpy((void *)((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                             _M_payload + 0x10),local_198,0x168);
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
      duration = dVar20;
      pdVar13 = local_260;
      paVar16 = (array<double,_2UL> *)
                ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                        _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                        _M_value.profile.brake + 8);
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        paVar16->_M_elems[0] = *pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
        paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
      }
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.
      duration = dVar1;
      pdVar13 = local_210;
      paVar16 = (array<double,_2UL> *)
                ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                        _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                        _M_value.profile.accel + 8);
      for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
        paVar16->_M_elems[0] = *pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
        paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
      }
      if (cVar10 == '\0') {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
      }
      lVar5 = lVar5 * 0x240;
      lVar9 = lVar9 * 0x240;
      dVar21 = *(double *)((long)valid_profiles + lVar5 + 0x68) +
               *(double *)((long)valid_profiles + lVar5 + 0x168) +
               *(double *)((long)valid_profiles + lVar5 + 0x1c0);
      local_290 = *(double *)((long)valid_profiles + lVar9 + 0x68) +
                  *(double *)((long)valid_profiles + lVar9 + 0x168) +
                  *(double *)((long)valid_profiles + lVar9 + 0x1c0);
      local_288 = dVar21;
      if (local_290 <= dVar21) {
        lVar9 = lVar5;
        local_288 = local_290;
        local_290 = dVar21;
      }
      pvVar18 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems + lVar9);
    }
    else {
      lVar9 = lVar9 * 0x240;
      dVar20 = *(double *)((long)pvVar18 + 0x68) + *(double *)((long)pvVar18 + 0x168) +
               *(double *)((long)pvVar18 + 0x1c0);
      dVar22 = *(double *)((long)valid_profiles + lVar9 + 0x68) +
               *(double *)((long)valid_profiles + lVar9 + 0x168) +
               *(double *)((long)valid_profiles + lVar9 + 0x1c0);
      __src_00 = (void *)((long)valid_profiles + lVar9);
      dVar21 = dVar20;
      if (dVar22 <= dVar20) {
        __src_00 = pvVar18;
        dVar21 = dVar22;
        dVar22 = dVar20;
      }
      memcpy(local_198,__src_00,0x168);
      dVar20 = *(double *)((long)__src_00 + 0x168);
      puVar12 = (undefined8 *)((long)__src_00 + 0x170);
      puVar15 = local_260;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar15 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      dVar1 = *(double *)((long)__src_00 + 0x1c0);
      pdVar13 = (double *)((long)__src_00 + 0x1c8);
      pdVar11 = local_210;
      for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
        *pdVar11 = *pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
        pdVar11 = pdVar11 + (ulong)bVar19 * -2 + 1;
      }
      local_1a0 = *(undefined4 *)((long)__src_00 + 0x238);
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar21;
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar22;
      memcpy((void *)((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                             _M_payload + 0x10),local_198,0x168);
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
      duration = dVar20;
      pdVar13 = local_260;
      paVar16 = (array<double,_2UL> *)
                ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                        _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                        _M_value.profile.brake + 8);
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        paVar16->_M_elems[0] = *pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
        paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
      }
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.
      duration = dVar1;
      pdVar13 = local_210;
      paVar16 = (array<double,_2UL> *)
                ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                        _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                        _M_value.profile.accel + 8);
      for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
        paVar16->_M_elems[0] = *pdVar13;
        pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
        paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
      }
      if (cVar10 == '\0') {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
      }
      lVar5 = lVar5 * 0x240;
      local_288 = *(double *)((long)pvVar17 + 0x68) + *(double *)((long)pvVar17 + 0x168) +
                  *(double *)((long)pvVar17 + 0x1c0);
      dVar21 = *(double *)((long)valid_profiles + lVar5 + 0x68) +
               *(double *)((long)valid_profiles + lVar5 + 0x168) +
               *(double *)((long)valid_profiles + lVar5 + 0x1c0);
      pvVar18 = (void *)((long)valid_profiles + lVar5);
      local_290 = dVar21;
      if (dVar21 <= local_288) {
        pvVar18 = pvVar17;
        local_290 = local_288;
        local_288 = dVar21;
      }
    }
    memcpy(local_198,pvVar18,0x168);
    dVar21 = *(double *)((long)pvVar18 + 0x168);
    pdVar13 = (double *)((long)pvVar18 + 0x170);
    pdVar11 = local_260;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar11 = *pdVar13;
      pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
      pdVar11 = pdVar11 + (ulong)bVar19 * -2 + 1;
    }
    dVar22 = *(double *)((long)pvVar18 + 0x1c0);
    pdVar13 = (double *)((long)pvVar18 + 0x1c8);
    pdVar11 = local_210;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar11 = *pdVar13;
      pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
      pdVar11 = pdVar11 + (ulong)bVar19 * -2 + 1;
    }
    local_1a0 = *(undefined4 *)((long)pvVar18 + 0x238);
    (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = local_288;
    (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = local_290;
    memcpy((void *)((long)&(block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                           _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                           _M_payload + 0x10),local_198,0x168);
    (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.duration
         = dVar21;
    pdVar13 = local_260;
    paVar16 = (array<double,_2UL> *)
              ((long)&(block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                      _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                      _M_value.profile.brake + 8);
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      paVar16->_M_elems[0] = *pdVar13;
      pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
      paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
    }
    (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.duration
         = dVar22;
    pdVar13 = local_210;
    paVar16 = (array<double,_2UL> *)
              ((long)&(block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                      _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                      _M_value.profile.accel + 8);
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      paVar16->_M_elems[0] = *pdVar13;
      pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
      paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
    }
    if (cVar7 != '\0') {
      return true;
    }
    (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
    return true;
  }
  if (valid_profile_counter != 3) {
    return false;
  }
  lVar9 = (lVar4 + ((lVar4 + 1U) / 3) * -3 + 1) * 0x240;
  lVar4 = (((lVar4 + 2U) / 3) * -3 + lVar4 + 2) * 0x240;
  dVar20 = *(double *)((long)valid_profiles + lVar9 + 0x68) +
           *(double *)((long)valid_profiles + lVar9 + 0x168) +
           *(double *)((long)valid_profiles + lVar9 + 0x1c0);
  dVar22 = *(double *)((long)valid_profiles + lVar4 + 0x68) +
           *(double *)((long)valid_profiles + lVar4 + 0x168) +
           *(double *)((long)valid_profiles + lVar4 + 0x1c0);
  dVar21 = dVar20;
  if (dVar22 <= dVar20) {
    lVar4 = lVar9;
    dVar21 = dVar22;
    dVar22 = dVar20;
  }
  pvVar18 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems + lVar4);
  memcpy(local_198,pvVar18,0x168);
  dVar20 = *(double *)((long)pvVar18 + 0x168);
  pdVar13 = (double *)((long)pvVar18 + 0x170);
  pdVar11 = local_260;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar11 = *pdVar13;
    pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
    pdVar11 = pdVar11 + (ulong)bVar19 * -2 + 1;
  }
  local_298 = *(double *)((long)pvVar18 + 0x1c0);
  puVar12 = (undefined8 *)((long)pvVar18 + 0x1c8);
  puVar15 = local_210;
  for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar15 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
    puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
  }
  local_1a0 = *(undefined4 *)((long)pvVar18 + 0x238);
  (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
  super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar21;
  (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
  super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar22;
  memcpy((void *)((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                         _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload
                 + 0x10),local_198,0x168);
  (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
  super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.duration =
       dVar20;
  lVar4 = 10;
  pdVar13 = local_260;
  paVar16 = (array<double,_2UL> *)
            ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.
                    profile.brake + 8);
LAB_00143577:
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    paVar16->_M_elems[0] = *pdVar13;
    pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
    paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
  }
  (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
  super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.duration =
       local_298;
  pdVar13 = local_210;
  paVar16 = (array<double,_2UL> *)
            ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.
                    profile.accel + 8);
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    paVar16->_M_elems[0] = *pdVar13;
    pdVar13 = pdVar13 + (ulong)bVar19 * -2 + 1;
    paVar16 = (array<double,_2UL> *)(paVar16[-(ulong)bVar19]._M_elems + 1);
  }
  if (cVar10 == '\0') {
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
  }
  return true;
}

Assistant:

static bool calculate_block(Block& block, std::array<Profile, N>& valid_profiles, size_t valid_profile_counter) {
        // std::cout << "---\n " << valid_profile_counter << std::endl;
        // for (size_t i = 0; i < valid_profile_counter; ++i) {
        //     std::cout << valid_profiles[i].t_sum.back() << " " << valid_profiles[i].to_string() << std::endl;
        // }

        if (valid_profile_counter == 1) {
            block.set_min_profile(valid_profiles[0]);
            return true;

        } else if (valid_profile_counter == 2) {
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 8 * std::numeric_limits<double>::epsilon()) {
                block.set_min_profile(valid_profiles[0]);
                return true;
            }

            if constexpr (numerical_robust) {
                const size_t idx_min = (valid_profiles[0].t_sum.back() < valid_profiles[1].t_sum.back()) ? 0 : 1;
                const size_t idx_else_1 = (idx_min + 1) % 2;

                block.set_min_profile(valid_profiles[idx_min]);
                block.a = Interval(valid_profiles[idx_min], valid_profiles[idx_else_1]);
                return true;
            }

        // Only happens due to numerical issues
        } else if (valid_profile_counter == 4) {
            // Find "identical" profiles
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 32 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[1].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 1);
            } else if (std::abs(valid_profiles[2].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[2].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else {
                return false;
            }

        } else if (valid_profile_counter % 2 == 0) {
            return false;
        }

        // Find index of fastest profile
        const auto idx_min_it = std::min_element(valid_profiles.cbegin(), valid_profiles.cbegin() + valid_profile_counter, [](const Profile& a, const Profile& b) { return a.t_sum.back() < b.t_sum.back(); });
        const size_t idx_min = std::distance(valid_profiles.cbegin(), idx_min_it);

        block.set_min_profile(valid_profiles[idx_min]);

        if (valid_profile_counter == 3) {
            const size_t idx_else_1 = (idx_min + 1) % 3;
            const size_t idx_else_2 = (idx_min + 2) % 3;

            block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
            return true;

        } else if (valid_profile_counter == 5) {
            const size_t idx_else_1 = (idx_min + 1) % 5;
            const size_t idx_else_2 = (idx_min + 2) % 5;
            const size_t idx_else_3 = (idx_min + 3) % 5;
            const size_t idx_else_4 = (idx_min + 4) % 5;

            if (valid_profiles[idx_else_1].direction == valid_profiles[idx_else_2].direction) {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
                block.b = Interval(valid_profiles[idx_else_3], valid_profiles[idx_else_4]);
            } else {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_4]);
                block.b = Interval(valid_profiles[idx_else_2], valid_profiles[idx_else_3]);
            }
            return true;
        }

        return false;
    }